

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O2

void __thiscall llvm::SmallPtrSetImplBase::Grow(SmallPtrSetImplBase *this,uint NewSize)

{
  uint uVar1;
  void **ppvVar2;
  void **__ptr;
  void *Ptr;
  void **ppvVar3;
  uint *puVar4;
  long lVar5;
  
  ppvVar2 = this->SmallArray;
  __ptr = this->CurArray;
  puVar4 = &this->CurArraySize;
  if (__ptr == ppvVar2) {
    puVar4 = &this->NumNonEmpty;
  }
  uVar1 = *puVar4;
  ppvVar3 = (void **)safe_malloc((ulong)NewSize << 3);
  this->CurArray = ppvVar3;
  this->CurArraySize = NewSize;
  memset(ppvVar3,0xff,(ulong)NewSize << 3);
  for (lVar5 = 0; (ulong)uVar1 << 3 != lVar5; lVar5 = lVar5 + 8) {
    Ptr = *(void **)((long)__ptr + lVar5);
    if (Ptr < (void *)0xfffffffffffffffe) {
      ppvVar3 = FindBucketFor(this,Ptr);
      *ppvVar3 = Ptr;
    }
  }
  if (__ptr != ppvVar2) {
    free(__ptr);
  }
  this->NumNonEmpty = this->NumNonEmpty - this->NumTombstones;
  this->NumTombstones = 0;
  return;
}

Assistant:

void SmallPtrSetImplBase::Grow(unsigned NewSize) {
  const void **OldBuckets = CurArray;
  const void **OldEnd = EndPointer();
  bool WasSmall = isSmall();

  // Install the new array.  Clear all the buckets to empty.
  const void **NewBuckets = (const void**) safe_malloc(sizeof(void*) * NewSize);

  // Reset member only if memory was allocated successfully
  CurArray = NewBuckets;
  CurArraySize = NewSize;
  memset(CurArray, -1, NewSize*sizeof(void*));

  // Copy over all valid entries.
  for (const void **BucketPtr = OldBuckets; BucketPtr != OldEnd; ++BucketPtr) {
    // Copy over the element if it is valid.
    const void *Elt = *BucketPtr;
    if (Elt != getTombstoneMarker() && Elt != getEmptyMarker())
      *const_cast<void**>(FindBucketFor(Elt)) = const_cast<void*>(Elt);
  }

  if (!WasSmall)
    free(OldBuckets);
  NumNonEmpty -= NumTombstones;
  NumTombstones = 0;
}